

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::MaybeListEditQual(AsciiParser *this,ListEditQual *qual)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ListEditQual LVar4;
  string tok;
  string local_40;
  
  bVar2 = SkipWhitespace(this);
  if (bVar2) {
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    uVar1 = this->_sr->idx_;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    bVar2 = ReadIdentifier(this,&local_40);
    if (bVar2) {
      iVar3 = ::std::__cxx11::string::compare((char *)&local_40);
      if (iVar3 == 0) {
        LVar4 = Prepend;
      }
      else {
        iVar3 = ::std::__cxx11::string::compare((char *)&local_40);
        if (iVar3 == 0) {
          LVar4 = Append;
        }
        else {
          iVar3 = ::std::__cxx11::string::compare((char *)&local_40);
          if (iVar3 == 0) {
            LVar4 = Add;
          }
          else {
            iVar3 = ::std::__cxx11::string::compare((char *)&local_40);
            if (iVar3 == 0) {
              LVar4 = Delete;
            }
            else {
              iVar3 = ::std::__cxx11::string::compare((char *)&local_40);
              if (iVar3 == 0) {
                LVar4 = Order;
              }
              else {
                LVar4 = ResetToExplicit;
                if (uVar1 <= this->_sr->length_) {
                  this->_sr->idx_ = uVar1;
                }
              }
            }
          }
        }
      }
      *qual = LVar4;
      bVar2 = SkipWhitespace(this);
    }
    else {
      if (uVar1 <= this->_sr->length_) {
        this->_sr->idx_ = uVar1;
      }
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AsciiParser::MaybeListEditQual(tinyusdz::ListEditQual *qual) {
  if (!SkipWhitespace()) {
    return false;
  }

  std::string tok;

  auto loc = CurrLoc();
  if (!ReadIdentifier(&tok)) {
    SeekTo(loc);
    return false;
  }

  if (tok == "prepend") {
    DCOUT("`prepend` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Prepend;
  } else if (tok == "append") {
    DCOUT("`append` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Append;
  } else if (tok == "add") {
    DCOUT("`add` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Add;
  } else if (tok == "delete") {
    DCOUT("`delete` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Delete;
  } else if (tok == "order") {
    DCOUT("`order` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Order;
  } else {
    DCOUT("No ListEdit qualifier.");
    // unqualified
    // rewind
    SeekTo(loc);
    (*qual) = tinyusdz::ListEditQual::ResetToExplicit;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  return true;
}